

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall MT32Emu::Synth::setReverbEnabled(Synth *this,bool newReverbEnabled)

{
  bool bVar1;
  
  if ((this->opened == true) && ((this->reverbModel != (BReverbModel *)0x0) != newReverbEnabled)) {
    if (newReverbEnabled) {
      bVar1 = this->reverbOverridden;
      this->reverbOverridden = false;
      refreshSystemReverbParameters(this);
      this->reverbOverridden = bVar1;
    }
    else {
      if (this->extensions->preallocatedReverbMemory == false) {
        (*this->reverbModel->_vptr_BReverbModel[4])();
      }
      this->reverbModel = (BReverbModel *)0x0;
    }
  }
  return;
}

Assistant:

void Synth::setReverbEnabled(bool newReverbEnabled) {
	if (!opened) return;
	if (isReverbEnabled() == newReverbEnabled) return;
	if (newReverbEnabled) {
		bool oldReverbOverridden = reverbOverridden;
		reverbOverridden = false;
		refreshSystemReverbParameters();
		reverbOverridden = oldReverbOverridden;
	} else {
		if (!extensions.preallocatedReverbMemory) {
			reverbModel->close();
		}
		reverbModel = NULL;
	}
}